

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O1

QSize __thiscall QDockAreaLayoutInfo::size(QDockAreaLayoutInfo *this)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  
  uVar3 = 0;
  lVar4 = 0;
  do {
    if ((ulong)(this->item_list).d.size <= uVar3) goto LAB_003f5d09;
    bVar1 = QDockAreaLayoutItem::skip
                      ((QDockAreaLayoutItem *)((long)&((this->item_list).d.ptr)->widgetItem + lVar4)
                      );
    lVar4 = lVar4 + 0x28;
    uVar3 = uVar3 + 1;
  } while (bVar1);
  if (lVar4 == 0) {
LAB_003f5d09:
    uVar2 = 0;
    uVar3 = 0;
  }
  else {
    uVar3 = (ulong)(((this->rect).x2.m_i - (this->rect).x1.m_i) + 1);
    uVar2 = (ulong)(((this->rect).y2.m_i - (this->rect).y1.m_i) + 1) << 0x20;
  }
  return (QSize)(uVar2 | uVar3);
}

Assistant:

QSize QDockAreaLayoutInfo::size() const
{
    return isEmpty() ? QSize(0, 0) : rect.size();
}